

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Percentile.cpp
# Opt level: O0

void __thiscall Percentile::~Percentile(Percentile *this)

{
  Percentile *in_RDI;
  
  ~Percentile(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

Percentile::~Percentile()
{
}